

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd_tls.h
# Opt level: O2

void je_sdallocx_noflags(void *ptr,size_t size)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  
  if ((char)*in_FS_OFFSET == '\0') {
    lVar3 = *in_FS_OFFSET;
    uVar4 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
    if (((*(ulong *)(lVar3 + 0x30 + uVar4) == ((ulong)ptr & 0xffffffffc0000000)) &&
        (uVar4 = *(ulong *)(*(long *)(uVar4 + lVar3 + 0x38) +
                           (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8)), (uVar4 & 1) != 0)) &&
       (lVar2 = in_FS_OFFSET[0x3f], *(int *)(in_FS_OFFSET + 0x3f) = (int)lVar2 + -1, 0 < (int)lVar2)
       ) {
      uVar4 = uVar4 >> 0x30;
      uVar1 = *(uint *)(lVar3 + 0x204 + uVar4 * 0x18);
      if (uVar1 != tcache_bin_info[uVar4].ncached_max) {
        lVar3 = lVar3 + uVar4 * 0x18;
        *(uint *)(lVar3 + 0x204) = uVar1 + 1;
        *(void **)(*(long *)(lVar3 + 0x210) + (long)(int)~uVar1 * 8) = ptr;
        in_FS_OFFSET[3] = in_FS_OFFSET[3] + sz_index2size_tab[uVar4];
        return;
      }
    }
  }
  sdallocx_default(ptr,size,0);
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE tsd_t *
tsd_get(bool init) {
	return &tsd_tls;
}